

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void ta(int pi)

{
  int got;
  size_t sVar1;
  int in_EDI;
  char text [2048];
  char *TEXT;
  int e;
  int b;
  int h;
  undefined4 in_stack_fffffffffffff7b8;
  int iVar2;
  undefined4 in_stack_fffffffffffff7bc;
  int iVar3;
  undefined8 in_stack_fffffffffffff7c0;
  char *pcVar4;
  int pc;
  int in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  int in_stack_fffffffffffff7d0;
  int st;
  int in_stack_fffffffffffff7d4;
  int t;
  char local_818 [2048];
  char *local_18;
  undefined4 local_10;
  int local_c;
  int local_8;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  local_4 = in_EDI;
  printf("Serial link tests.\n");
  local_8 = serial_open(local_4,"/dev/ttyAMA0",0xe100,0);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
        in_stack_fffffffffffff7c8,iVar2,
        (char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  time_sleep(0x3fb999999999999a);
  local_c = serial_read(local_4,local_8,local_818,0x800);
  local_c = serial_data_available(local_4,local_8);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
        in_stack_fffffffffffff7c8,iVar2,
        (char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
  local_18 = 
  "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
  ;
  pcVar4 = 
  "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
  ;
  iVar2 = local_4;
  iVar3 = local_8;
  sVar1 = strlen(
                "To be, or not to be, that is the question-Whether \'tis Nobler in the mind to sufferThe Slings and Arrows of outrageous Fortune,Or to take Arms against a Sea of troubles,"
                );
  local_10 = serial_write(iVar2,iVar3,pcVar4,sVar1 & 0xffffffff);
  pc = (int)((ulong)pcVar4 >> 0x20);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
        in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_10 = serial_write_byte(local_4,local_8,0xaa);
  local_10 = serial_write_byte(local_4,local_8,0x55);
  local_10 = serial_write_byte(local_4,local_8,0);
  local_10 = serial_write_byte(local_4,local_8,0xff);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
        in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  time_sleep(0x3fb999999999999a);
  got = serial_data_available(local_4,local_8);
  local_c = got;
  strlen(local_18);
  CHECK(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0,got,in_stack_fffffffffffff7c8,pc,
        (char *)CONCAT44(iVar3,iVar2));
  st = local_4;
  t = local_8;
  sVar1 = strlen(local_18);
  local_c = serial_read(st,t,local_818,sVar1 & 0xffffffff);
  strlen(local_18);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  if (-1 < local_c) {
    local_818[local_c] = '\0';
  }
  strcmp(local_18,local_818);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_c = serial_read_byte(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_c = serial_read_byte(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_c = serial_read_byte(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_c = serial_read_byte(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_c = serial_data_available(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  local_10 = serial_close(local_4,local_8);
  CHECK(t,st,got,in_stack_fffffffffffff7c8,pc,(char *)CONCAT44(iVar3,iVar2));
  return;
}

Assistant:

void ta(int pi)
{
   int h, b, e;
   char *TEXT;
   char text[2048];

   printf("Serial link tests.\n");

   /* this test needs RXD and TXD to be connected */

   h = serial_open(pi, "/dev/ttyAMA0", 57600, 0);

   CHECK(10, 1, h, 0, 0, "serial open");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_read(pi, h, text, sizeof(text)); /* flush buffer */

   b = serial_data_available(pi, h);
   CHECK(10, 2, b, 0, 0, "serial data available");

   TEXT = "\
To be, or not to be, that is the question-\
Whether 'tis Nobler in the mind to suffer\
The Slings and Arrows of outrageous Fortune,\
Or to take Arms against a Sea of troubles,\
";
   e = serial_write(pi, h, TEXT, strlen(TEXT));
   CHECK(10, 3, e, 0, 0, "serial write");

   e = serial_write_byte(pi, h, 0xAA);
   e = serial_write_byte(pi, h, 0x55);
   e = serial_write_byte(pi, h, 0x00);
   e = serial_write_byte(pi, h, 0xFF);

   CHECK(10, 4, e, 0, 0, "serial write byte");

   time_sleep(0.1); /* allow time for transmission */

   b = serial_data_available(pi, h);
   CHECK(10, 5, b, strlen(TEXT)+4, 0, "serial data available");

   b = serial_read(pi, h, text, strlen(TEXT));
   CHECK(10, 6, b, strlen(TEXT), 0, "serial read");
   if (b >= 0) text[b] = 0;
   CHECK(10, 7, strcmp(TEXT, text), 0, 0, "serial read");

   b = serial_read_byte(pi, h);
   CHECK(10, 8, b, 0xAA, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 9, b, 0x55, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 10, b, 0x00, 0, "serial read byte");

   b = serial_read_byte(pi, h);
   CHECK(10, 11, b, 0xFF, 0, "serial read byte");

   b = serial_data_available(pi, h);
   CHECK(10, 12, b, 0, 0, "serial data availabe");

   e = serial_close(pi, h);
   CHECK(10, 13, e, 0, 0, "serial close");
}